

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void __thiscall DLevelScript::DLevelScript(DLevelScript *this)

{
  DACSThinker *this_00;
  
  DObject::DObject(&this->super_DObject);
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_00849ad0;
  this->next = (DLevelScript *)0x0;
  this->prev = (DLevelScript *)0x0;
  if (DACSThinker::ActiveThinker.field_0 != (DACSThinker *)0x0) {
    if ((*(byte *)((long)DACSThinker::ActiveThinker.field_0 + 0x20) & 0x20) == 0) goto LAB_004df208;
    DACSThinker::ActiveThinker.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DACSThinker>_1)0x0;
  }
  this_00 = (DACSThinker *)
            M_Malloc_Dbg(0x60,
                         "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobject.h"
                         ,0x1f7);
  DACSThinker::DACSThinker(this_00);
LAB_004df208:
  this->activefont = SmallFont;
  this->localvars = (SDWORD *)0x0;
  return;
}

Assistant:

DLevelScript::DLevelScript ()
{
	next = prev = NULL;
	if (DACSThinker::ActiveThinker == NULL)
		new DACSThinker;
	activefont = SmallFont;
	localvars = NULL;
}